

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TapePRG.cpp
# Opt level: O1

void __thiscall Storage::Tape::PRG::PRG(PRG *this,string *file_name)

{
  FileHolder *this_00;
  uint16_t uVar1;
  uint uVar2;
  stat *psVar3;
  undefined4 *puVar4;
  
  (this->super_Tape).pulse_.length.length = 0;
  (this->super_Tape).pulse_.length.clock_rate = 1;
  (this->super_Tape)._vptr_Tape = (_func_int **)&PTR_is_at_end_005ab510;
  this_00 = &this->file_;
  FileHolder::FileHolder(this_00,file_name,ReadWrite);
  this->file_phase_ = FilePhaseLeadIn;
  this->phase_offset_ = 0;
  this->bit_phase_ = 3;
  this->copy_mask_ = 0x80;
  psVar3 = FileHolder::stats(this_00);
  if (psVar3->st_size < 0x10002) {
    psVar3 = FileHolder::stats(this_00);
    if (2 < psVar3->st_size) {
      uVar1 = FileHolder::get16le(this_00);
      this->load_address_ = uVar1;
      psVar3 = FileHolder::stats(this_00);
      uVar2 = (int)psVar3->st_size - 2;
      this->length_ = (uint16_t)uVar2;
      if ((uVar2 & 0xffff) + (uint)this->load_address_ < 0x10000) {
        return;
      }
    }
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&{unnamed_type#1}::typeinfo,0);
}

Assistant:

PRG::PRG(const std::string &file_name) :
	file_(file_name)
{
	// There's really no way to validate other than that if this file is larger than 64kb,
	// of if load address + length > 65536 then it's broken.
	if(file_.stats().st_size >= 65538 || file_.stats().st_size < 3)
		throw ErrorBadFormat;

	load_address_ = file_.get16le();
	length_ = uint16_t(file_.stats().st_size - 2);

	if (load_address_ + length_ >= 65536)
		throw ErrorBadFormat;
}